

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O2

void CompiledMixedType<unsigned_long,long>(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar3;
  long u;
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> su;
  ulong local_40;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter> st2;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_30;
  
  u = 0;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<long>
            (&local_30,&u);
  su.m_int = u;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<long>
            (&st2,&su);
  local_30.m_int = 0;
  SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
             &local_30,&u);
  if (-1 < su.m_int) {
    local_30.m_int = st2.m_int;
    SafeInt::operator_cast_to_long((SafeInt *)&local_30);
    SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*
              ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_30,u);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_30.m_int;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = st2.m_int;
    if (SUB168(auVar1 * auVar2,8) == 0) {
      operator*(u,local_30);
      SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
                ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_30,u);
      SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
                ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_30,su);
      u = 1;
      local_40._0_4_ = 1;
      SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
                ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_30,(int *)&local_40);
      su.m_int = 1;
      SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
                ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_30,u);
      local_40._0_4_ = 1;
      SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
                ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)&st2
                 ,(int *)&local_40);
      SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
                (&local_30,st2);
      SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
                ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_30,u);
      SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
                ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_30,su);
      u = 1;
      local_40._0_4_ = 1;
      SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
                ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)&st2
                 ,(int *)&local_40);
      local_40._0_4_ = 1;
      SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
                ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_30,(int *)&local_40);
      SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/
                ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_30,u);
      SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator/
                (&local_30,st2);
      operator/(u,local_30);
      SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
                ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_30,u);
      SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
                ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_30,su);
      SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
                ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_30,u);
      SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
                (&local_30,st2);
      operator+(u,local_30);
      SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
                ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_30,u);
      SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
                ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_30,su);
      local_40._0_4_ = 0;
      SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
                ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_30,(int *)&local_40);
      u = 0;
      local_40._0_4_ = 0;
      SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
                ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)&st2
                 ,(int *)&local_40);
      SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-
                ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_30,u);
      SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator-
                (&local_30,st2);
      operator-(u,(SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter>)
                  su.m_int);
      SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
                ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_30,u);
      local_40 = CONCAT44(local_40._4_4_,1);
      SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
                ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_30,(int *)&local_40);
      su.m_int = 1;
      SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
                ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_30,(SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1)
      ;
      u = 1;
      su.m_int = 1;
      SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
                ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_30,1);
      SVar3 = SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::
              operator<<((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>
                          *)&local_30,su);
      operator<<(SVar3.m_int,su);
      SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
                ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_30,u);
      SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
                ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_30,su);
      SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
                ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_30,u);
      SVar3 = SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::
              operator>>((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>
                          *)&local_30,su);
      operator>>(SVar3.m_int,su);
      SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
                ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_30,u);
      SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
                ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_30,su);
      local_40 = u & local_30.m_int & su.m_int;
      SafeInt::operator_cast_to_unsigned_long((SafeInt *)&local_40);
      local_30.m_int = su.m_int & u & local_30.m_int & st2.m_int;
      local_40 = su.m_int | u;
      SafeInt::operator_cast_to_unsigned_long((SafeInt *)&local_40);
      local_30.m_int = su.m_int | u | local_30.m_int | st2.m_int;
      local_40 = su.m_int ^ u ^ local_30.m_int;
      SafeInt::operator_cast_to_unsigned_long((SafeInt *)&local_40);
      return;
    }
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}